

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::BoundaryApproxIntersects(S2Loop *this,Iterator *it,S2Cell *target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *this_01;
  S2CellId x;
  S2Point *a_xyz;
  S2Point *b_xyz;
  undefined1 local_f0 [8];
  R2Point v1;
  R2Point v0;
  int ai;
  int i;
  undefined1 local_a8 [8];
  R2Rect bound;
  int a_num_edges;
  S2ClippedShape *a_clipped;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  uint64 local_38;
  S2CellId local_30;
  S2Cell *local_28;
  S2Cell *target_local;
  Iterator *it_local;
  S2Loop *this_local;
  
  local_28 = target;
  target_local = (S2Cell *)it;
  it_local = (Iterator *)this;
  local_30 = S2ShapeIndex::IteratorBase::id(&it->super_IteratorBase);
  local_38 = (uint64)S2Cell::id(local_28);
  bVar1 = S2CellId::contains(&local_30,(S2CellId)local_38);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x1e5,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream(&local_50);
    poVar4 = std::operator<<(poVar4,"Check failed: it.id().contains(target.id()) ");
    S2LogMessageVoidify::operator&(&local_39,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  this_00 = MutableS2ShapeIndex::Iterator::cell((Iterator *)target_local);
  this_01 = S2ShapeIndexCell::clipped(this_00,0);
  iVar2 = S2ClippedShape::num_edges(this_01);
  if (iVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    x = S2ShapeIndex::IteratorBase::id((IteratorBase *)target_local);
    register0x00000000 = S2Cell::id(local_28);
    bVar1 = ::operator==(x,register0x00000000);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      if ((BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)::kMaxError
           == '\0') &&
         (iVar3 = __cxa_guard_acquire(&BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)
                                       ::kMaxError), iVar3 != 0)) {
        BoundaryApproxIntersects::kMaxError = 2.3551386880256627e-15;
        __cxa_guard_release(&BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)
                             ::kMaxError);
      }
      S2Cell::GetBoundUV((R2Rect *)&ai,local_28);
      R2Rect::Expanded((R2Rect *)local_a8,(R2Rect *)&ai,BoundaryApproxIntersects::kMaxError);
      for (v0.c_[1]._4_4_ = 0; v0.c_[1]._4_4_ < iVar2; v0.c_[1]._4_4_ = v0.c_[1]._4_4_ + 1) {
        iVar3 = S2ClippedShape::edge(this_01,v0.c_[1]._4_4_);
        Vector2<double>::Vector2((Vector2<double> *)(v1.c_ + 1));
        Vector2<double>::Vector2((Vector2<double> *)local_f0);
        a_xyz = vertex(this,iVar3);
        b_xyz = vertex(this,iVar3 + 1);
        iVar3 = S2Cell::face(local_28);
        bVar1 = S2::ClipToPaddedFace
                          (a_xyz,b_xyz,iVar3,BoundaryApproxIntersects::kMaxError,
                           (R2Point *)(v1.c_ + 1),(R2Point *)local_f0);
        if ((bVar1) &&
           (bVar1 = S2::IntersectsRect((R2Point *)(v1.c_ + 1),(R2Point *)local_f0,(R2Rect *)local_a8
                                      ), bVar1)) {
          return true;
        }
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2Loop::BoundaryApproxIntersects(const MutableS2ShapeIndex::Iterator& it,
                                      const S2Cell& target) const {
  S2_DCHECK(it.id().contains(target.id()));
  const S2ClippedShape& a_clipped = it.cell().clipped(0);
  int a_num_edges = a_clipped.num_edges();

  // If there are no edges, there is no intersection.
  if (a_num_edges == 0) return false;

  // We can save some work if "target" is the index cell itself.
  if (it.id() == target.id()) return true;

  // Otherwise check whether any of the edges intersect "target".
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  for (int i = 0; i < a_num_edges; ++i) {
    int ai = a_clipped.edge(i);
    R2Point v0, v1;
    if (S2::ClipToPaddedFace(vertex(ai), vertex(ai+1), target.face(),
                             kMaxError, &v0, &v1) &&
        S2::IntersectsRect(v0, v1, bound)) {
      return true;
    }
  }
  return false;
}